

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn.c
# Opt level: O1

int cmn_set_repr(cmn_t *cmn,char *repr)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  double dVar6;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn.c"
          ,0x7c,"Update from < %s >\n",cmn->repr);
  memset(cmn->cmn_mean,0,(long)cmn->veclen << 2);
  memset(cmn->sum,0,(long)cmn->veclen << 2);
  pcVar2 = __ckd_salloc__(repr,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn.c"
                          ,0x7f);
  bVar1 = 0 < cmn->veclen;
  if (0 < cmn->veclen) {
    pcVar3 = strchr(pcVar2,0x2c);
    pcVar4 = pcVar2;
    if (pcVar3 == (char *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = 0;
      do {
        *pcVar3 = '\0';
        dVar6 = atof_c(pcVar4);
        cmn->cmn_mean[lVar5] = (mfcc_t)(float)dVar6;
        cmn->sum[lVar5] = (mfcc_t)((float)dVar6 * 500.0);
        lVar5 = lVar5 + 1;
        bVar1 = lVar5 < cmn->veclen;
        if (cmn->veclen <= lVar5) goto LAB_00124797;
        pcVar4 = pcVar3 + 1;
        pcVar3 = strchr(pcVar4,0x2c);
      } while (pcVar3 != (char *)0x0);
    }
    if ((bVar1) && (*pcVar4 != '\0')) {
      dVar6 = atof_c(pcVar4);
      cmn->cmn_mean[lVar5] = (mfcc_t)(float)dVar6;
      cmn->sum[lVar5] = (mfcc_t)((float)dVar6 * 500.0);
    }
  }
LAB_00124797:
  ckd_free(pcVar2);
  cmn->nframe = 500;
  pcVar2 = cmn_update_repr(cmn);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn.c"
          ,0x90,"Update to   < %s >\n",pcVar2);
  return 0;
}

Assistant:

int
cmn_set_repr(cmn_t *cmn, const char *repr)
{
    char *c, *cc, *vallist;
    int32 nvals;

    E_INFO("Update from < %s >\n", cmn->repr);
    memset(cmn->cmn_mean, 0, sizeof(cmn->cmn_mean[0]) * cmn->veclen);
    memset(cmn->sum, 0, sizeof(cmn->sum[0]) * cmn->veclen);
    vallist = ckd_salloc(repr);
    c = vallist;
    nvals = 0;
    while (nvals < cmn->veclen
           && (cc = strchr(c, ',')) != NULL) {
        *cc = '\0';
        cmn->cmn_mean[nvals] = FLOAT2MFCC(atof_c(c));
        cmn->sum[nvals] = cmn->cmn_mean[nvals] * CMN_WIN;
        c = cc + 1;
        ++nvals;
    }
    if (nvals < cmn->veclen && *c != '\0') {
        cmn->cmn_mean[nvals] = FLOAT2MFCC(atof_c(c));
        cmn->sum[nvals] = cmn->cmn_mean[nvals] * CMN_WIN;
    }
    ckd_free(vallist);
    cmn->nframe = CMN_WIN;
    E_INFO("Update to   < %s >\n", cmn_update_repr(cmn));
    return 0;
}